

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx::SphereMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  RayHit *pRVar16;
  long lVar18;
  Scene *scene;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  SphereIntersectorHitM<4> hit;
  undefined1 local_1bc [28];
  RTCFilterFunctionNArguments local_1a0;
  uint local_16c [1];
  float local_168 [3];
  undefined8 local_15c;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar17;
  undefined1 auVar39 [64];
  undefined1 auVar42 [64];
  
  pSVar6 = context->scene;
  pGVar7 = (pSVar6->geometries).items[sphere->sharedGeomID].ptr;
  lVar18 = *(long *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar22 = *(undefined1 (*) [16])(lVar18 + (sphere->primIDs).field_0.i[0] * _Var8);
  auVar25 = *(undefined1 (*) [16])(lVar18 + (sphere->primIDs).field_0.i[1] * _Var8);
  auVar24 = *(undefined1 (*) [16])(lVar18 + (sphere->primIDs).field_0.i[2] * _Var8);
  auVar30 = *(undefined1 (*) [16])(lVar18 + (sphere->primIDs).field_0.i[3] * _Var8);
  auVar31 = vunpcklps_avx(auVar22,auVar24);
  auVar24 = vunpckhps_avx(auVar22,auVar24);
  auVar22 = vunpcklps_avx(auVar25,auVar30);
  auVar30 = vunpckhps_avx(auVar25,auVar30);
  auVar43 = vunpcklps_avx(auVar31,auVar22);
  auVar31 = vunpckhps_avx(auVar31,auVar22);
  auVar27 = vunpcklps_avx(auVar24,auVar30);
  auVar22 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar25 = vpcmpgtd_avx(auVar22,_DAT_01ff0cf0);
  local_48 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  aVar5 = (ray->super_RayK<1>).dir.field_0;
  auVar22 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  auVar23 = vunpckhps_avx(auVar24,auVar30);
  auVar24 = vrcpss_avx(auVar22,auVar22);
  auVar22 = ZEXT416((uint)(auVar24._0_4_ * (2.0 - auVar22._0_4_ * auVar24._0_4_)));
  auVar24 = vshufps_avx(auVar22,auVar22,0);
  uVar15 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar22._4_4_ = uVar15;
  auVar22._0_4_ = uVar15;
  auVar22._8_4_ = uVar15;
  auVar22._12_4_ = uVar15;
  auVar22 = vsubps_avx(auVar43,auVar22);
  uVar15 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar30._4_4_ = uVar15;
  auVar30._0_4_ = uVar15;
  auVar30._8_4_ = uVar15;
  auVar30._12_4_ = uVar15;
  auVar30 = vsubps_avx(auVar31,auVar30);
  uVar15 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar31._4_4_ = uVar15;
  auVar31._0_4_ = uVar15;
  auVar31._8_4_ = uVar15;
  auVar31._12_4_ = uVar15;
  auVar31 = vsubps_avx(auVar27,auVar31);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar49 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar50 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar51 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar32._0_4_ =
       auVar24._0_4_ * (fVar1 * auVar22._0_4_ + fVar2 * auVar30._0_4_ + fVar3 * auVar31._0_4_);
  auVar32._4_4_ =
       auVar24._4_4_ * (fVar1 * auVar22._4_4_ + fVar2 * auVar30._4_4_ + fVar3 * auVar31._4_4_);
  auVar32._8_4_ =
       auVar24._8_4_ * (fVar1 * auVar22._8_4_ + fVar2 * auVar30._8_4_ + fVar3 * auVar31._8_4_);
  auVar32._12_4_ =
       auVar24._12_4_ * (fVar1 * auVar22._12_4_ + fVar2 * auVar30._12_4_ + fVar3 * auVar31._12_4_);
  auVar43._0_4_ = fVar1 * auVar32._0_4_;
  auVar43._4_4_ = fVar1 * auVar32._4_4_;
  auVar43._8_4_ = fVar1 * auVar32._8_4_;
  auVar43._12_4_ = fVar1 * auVar32._12_4_;
  auVar45._0_4_ = fVar2 * auVar32._0_4_;
  auVar45._4_4_ = fVar2 * auVar32._4_4_;
  auVar45._8_4_ = fVar2 * auVar32._8_4_;
  auVar45._12_4_ = fVar2 * auVar32._12_4_;
  auVar47._0_4_ = fVar3 * auVar32._0_4_;
  auVar47._4_4_ = fVar3 * auVar32._4_4_;
  auVar47._8_4_ = fVar3 * auVar32._8_4_;
  auVar47._12_4_ = fVar3 * auVar32._12_4_;
  auVar43 = vsubps_avx(auVar22,auVar43);
  auVar44 = ZEXT1664(auVar43);
  auVar30 = vsubps_avx(auVar30,auVar45);
  auVar46 = ZEXT1664(auVar30);
  auVar31 = vsubps_avx(auVar31,auVar47);
  auVar48 = ZEXT1664(auVar31);
  auVar36._0_4_ =
       auVar43._0_4_ * auVar43._0_4_ + auVar30._0_4_ * auVar30._0_4_ + auVar31._0_4_ * auVar31._0_4_
  ;
  auVar36._4_4_ =
       auVar43._4_4_ * auVar43._4_4_ + auVar30._4_4_ * auVar30._4_4_ + auVar31._4_4_ * auVar31._4_4_
  ;
  auVar36._8_4_ =
       auVar43._8_4_ * auVar43._8_4_ + auVar30._8_4_ * auVar30._8_4_ + auVar31._8_4_ * auVar31._8_4_
  ;
  auVar36._12_4_ =
       auVar43._12_4_ * auVar43._12_4_ +
       auVar30._12_4_ * auVar30._12_4_ + auVar31._12_4_ * auVar31._12_4_;
  auVar27._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar27._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar27._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar27._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar22 = vcmpps_avx(auVar36,auVar27,2);
  auVar23 = auVar25 & auVar22;
  if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar23[0xf] < '\0') {
    auVar22 = vandps_avx(auVar22,auVar25);
    auVar25 = vsubps_avx(auVar27,auVar36);
    auVar23._0_4_ = auVar24._0_4_ * auVar25._0_4_;
    auVar23._4_4_ = auVar24._4_4_ * auVar25._4_4_;
    auVar23._8_4_ = auVar24._8_4_ * auVar25._8_4_;
    auVar23._12_4_ = auVar24._12_4_ * auVar25._12_4_;
    auVar27 = vsqrtps_avx(auVar23);
    auVar52 = ZEXT1664(auVar27);
    auVar36 = vsubps_avx(auVar32,auVar27);
    auVar41._0_4_ = auVar27._0_4_ + auVar32._0_4_;
    auVar41._4_4_ = auVar27._4_4_ + auVar32._4_4_;
    auVar41._8_4_ = auVar27._8_4_ + auVar32._8_4_;
    auVar41._12_4_ = auVar27._12_4_ + auVar32._12_4_;
    auVar42 = ZEXT1664(auVar41);
    uVar15 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar33._4_4_ = uVar15;
    auVar33._0_4_ = uVar15;
    auVar33._8_4_ = uVar15;
    auVar33._12_4_ = uVar15;
    auVar25 = vcmpps_avx(auVar33,auVar36,2);
    fVar4 = (ray->super_RayK<1>).tfar;
    auVar37._4_4_ = fVar4;
    auVar37._0_4_ = fVar4;
    auVar37._8_4_ = fVar4;
    auVar37._12_4_ = fVar4;
    auVar24 = vcmpps_avx(auVar36,auVar37,2);
    auVar25 = vandps_avx(auVar24,auVar25);
    auVar40 = ZEXT1664(auVar25);
    auVar25 = vandps_avx(auVar25,auVar22);
    auVar24 = vcmpps_avx(auVar33,auVar41,2);
    auVar23 = vcmpps_avx(auVar41,auVar37,2);
    auVar24 = vandps_avx(auVar24,auVar23);
    auVar22 = vandps_avx(auVar24,auVar22);
    auVar53 = ZEXT1664(auVar22);
    local_1bc._4_16_ = vorps_avx(auVar22,auVar25);
    if ((((local_1bc._4_16_ >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_1bc._4_16_ >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_1bc._4_16_ >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_1bc[0x13] < '\0') {
      local_128 = vblendvps_avx(auVar41,auVar36,auVar25);
      auVar54 = ZEXT1664(local_128);
      auVar24._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = -auVar27._8_4_;
      auVar24._12_4_ = -auVar27._12_4_;
      auVar22 = vblendvps_avx(auVar27,auVar24,auVar25);
      fVar4 = auVar22._0_4_;
      auVar28._0_4_ = fVar1 * fVar4;
      fVar10 = auVar22._4_4_;
      auVar28._4_4_ = fVar1 * fVar10;
      fVar11 = auVar22._8_4_;
      auVar28._8_4_ = fVar1 * fVar11;
      fVar12 = auVar22._12_4_;
      auVar28._12_4_ = fVar1 * fVar12;
      auVar34._0_4_ = fVar2 * fVar4;
      auVar34._4_4_ = fVar2 * fVar10;
      auVar34._8_4_ = fVar2 * fVar11;
      auVar34._12_4_ = fVar2 * fVar12;
      auVar25._0_4_ = fVar3 * fVar4;
      auVar25._4_4_ = fVar3 * fVar10;
      auVar25._8_4_ = fVar3 * fVar11;
      auVar25._12_4_ = fVar3 * fVar12;
      local_118 = vsubps_avx(auVar28,auVar43);
      local_108 = vsubps_avx(auVar34,auVar30);
      local_f8 = vsubps_avx(auVar25,auVar31);
      auVar38._8_4_ = 0x7f800000;
      auVar38._0_8_ = 0x7f8000007f800000;
      auVar38._12_4_ = 0x7f800000;
      auVar39 = ZEXT1664(auVar38);
      auVar22 = vblendvps_avx(auVar38,local_128,local_1bc._4_16_);
      auVar25 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar25 = vminps_avx(auVar25,auVar22);
      auVar24 = vshufpd_avx(auVar25,auVar25,1);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar22 = vcmpps_avx(auVar22,auVar25,0);
      auVar24 = local_1bc._4_16_ & auVar22;
      auVar25 = vpcmpeqd_avx(auVar25,auVar25);
      if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0'
         ) {
        auVar25 = auVar22;
      }
      auVar22 = vandps_avx(local_1bc._4_16_,auVar25);
      uVar13 = vmovmskps_avx(auVar22);
      lVar18 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
LAB_00e9f15a:
      auVar30 = auVar48._0_16_;
      auVar24 = auVar46._0_16_;
      auVar25 = auVar44._0_16_;
      auVar23 = auVar51._0_16_;
      auVar43 = auVar50._0_16_;
      auVar27 = auVar52._0_16_;
      auVar31 = auVar49._0_16_;
      auVar32 = auVar53._0_16_;
      auVar22 = auVar40._0_16_;
      local_150 = *(uint *)(local_48 + lVar18 * 4);
      pRVar16 = (RayHit *)(ulong)local_150;
      pGVar7 = (pSVar6->geometries).items[(long)pRVar16].ptr;
      if ((pGVar7->mask & (ray->super_RayK<1>).mask) == 0) {
        *(undefined4 *)(local_1bc + lVar18 * 4 + 4) = 0;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          (ray->super_RayK<1>).tfar = *(float *)(local_128 + lVar18 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_118 + lVar18 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_108 + lVar18 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_f8 + lVar18 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[lVar18];
          ray->geomID = local_150;
          ray->instID[0] = context->user->instID[0];
          uVar15 = 0;
          ray->instPrimID[0] = context->user->instPrimID[0];
LAB_00e9f510:
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar20._4_4_ = fVar1;
          auVar20._0_4_ = fVar1;
          auVar20._8_4_ = fVar1;
          auVar20._12_4_ = fVar1;
          local_128 = auVar42._0_16_;
          auVar36 = vcmpps_avx(local_128,auVar20,2);
          auVar22 = vandps_avx(auVar22,auVar36);
          auVar36 = auVar32 & auVar22;
          if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar36[0xf]) {
            return;
          }
          auVar22 = vandps_avx(auVar32,auVar22);
          fVar1 = auVar27._0_4_;
          auVar26._0_4_ = auVar31._0_4_ * fVar1;
          fVar2 = auVar27._4_4_;
          auVar26._4_4_ = auVar31._4_4_ * fVar2;
          fVar3 = auVar27._8_4_;
          auVar26._8_4_ = auVar31._8_4_ * fVar3;
          fVar4 = auVar27._12_4_;
          auVar26._12_4_ = auVar31._12_4_ * fVar4;
          auVar29._0_4_ = auVar43._0_4_ * fVar1;
          auVar29._4_4_ = auVar43._4_4_ * fVar2;
          auVar29._8_4_ = auVar43._8_4_ * fVar3;
          auVar29._12_4_ = auVar43._12_4_ * fVar4;
          auVar35._0_4_ = auVar23._0_4_ * fVar1;
          auVar35._4_4_ = auVar23._4_4_ * fVar2;
          auVar35._8_4_ = auVar23._8_4_ * fVar3;
          auVar35._12_4_ = auVar23._12_4_ * fVar4;
          local_118 = vsubps_avx(auVar26,auVar25);
          local_108 = vsubps_avx(auVar29,auVar24);
          local_f8 = vsubps_avx(auVar35,auVar30);
          pSVar6 = context->scene;
          local_1bc._4_16_ = auVar22;
          auVar25 = vblendvps_avx(auVar39._0_16_,local_128,auVar22);
          auVar24 = vshufps_avx(auVar25,auVar25,0xb1);
          auVar24 = vminps_avx(auVar24,auVar25);
          auVar30 = vshufpd_avx(auVar24,auVar24,1);
          auVar24 = vminps_avx(auVar30,auVar24);
          auVar25 = vcmpps_avx(auVar25,auVar24,0);
          auVar24 = auVar22 & auVar25;
          if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar24[0xf] < '\0') {
            auVar22 = vandps_avx(auVar25,auVar22);
          }
          uVar14 = vmovmskps_avx(auVar22);
          lVar18 = 0;
          if (CONCAT44(uVar15,uVar14) != 0) {
            for (; (CONCAT44(uVar15,uVar14) >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          do {
            local_150 = *(uint *)(local_48 + lVar18 * 4);
            pRVar16 = (RayHit *)(ulong)local_150;
            pGVar7 = (pSVar6->geometries).items[(long)pRVar16].ptr;
            if ((pGVar7->mask & (ray->super_RayK<1>).mask) == 0) {
              *(undefined4 *)(local_1bc + lVar18 * 4 + 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_128 + lVar18 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_118 + lVar18 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_108 + lVar18 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_f8 + lVar18 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[lVar18];
                ray->geomID = local_150;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_168[0] = *(float *)(local_118 + lVar18 * 4);
              local_168[1] = (float)*(undefined4 *)(local_108 + lVar18 * 4);
              local_168[2] = (float)*(undefined4 *)(local_f8 + lVar18 * 4);
              local_15c = 0;
              local_154 = (sphere->primIDs).field_0.i[lVar18];
              local_14c = context->user->instID[0];
              local_148 = context->user->instPrimID[0];
              local_e8._0_4_ = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_128 + lVar18 * 4);
              local_1bc._0_4_ = -NAN;
              local_1a0.valid = (int *)local_1bc;
              local_1a0.geometryUserPtr = pGVar7->userPtr;
              local_1a0.context = context->user;
              local_1a0.ray = (RTCRayN *)ray;
              local_1a0.hit = (RTCHitN *)local_168;
              local_1a0.N = 1;
              local_138 = auVar42._0_16_;
              if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e9f6d0:
                p_Var9 = context->args->filter;
                if (p_Var9 != (RTCFilterFunctionN)0x0) {
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar7->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var9)(&local_1a0);
                    auVar39 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar42 = ZEXT1664(local_138);
                  }
                  if ((((RayK<1> *)local_1a0.valid)->org).field_0.m128[0] == 0.0) goto LAB_00e9f7c2;
                }
                (((Vec3f *)((long)local_1a0.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_1a0.hit;
                *(float *)((long)local_1a0.ray + 0x34) = *(float *)(local_1a0.hit + 4);
                *(float *)((long)local_1a0.ray + 0x38) = *(float *)(local_1a0.hit + 8);
                *(float *)((long)local_1a0.ray + 0x3c) = *(float *)(local_1a0.hit + 0xc);
                *(float *)((long)local_1a0.ray + 0x40) = *(float *)(local_1a0.hit + 0x10);
                *(float *)((long)local_1a0.ray + 0x44) = *(float *)(local_1a0.hit + 0x14);
                *(float *)((long)local_1a0.ray + 0x48) = *(float *)(local_1a0.hit + 0x18);
                *(float *)((long)local_1a0.ray + 0x4c) = *(float *)(local_1a0.hit + 0x1c);
                *(float *)((long)local_1a0.ray + 0x50) = *(float *)(local_1a0.hit + 0x20);
                pRVar16 = (RayHit *)local_1a0.ray;
              }
              else {
                (*pGVar7->intersectionFilterN)(&local_1a0);
                auVar39 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar42 = ZEXT1664(local_138);
                if ((((RayK<1> *)local_1a0.valid)->org).field_0.m128[0] != 0.0) goto LAB_00e9f6d0;
LAB_00e9f7c2:
                (ray->super_RayK<1>).tfar = (float)local_e8._0_4_;
                pRVar16 = (RayHit *)local_1a0.valid;
              }
              *(undefined4 *)(local_1bc + lVar18 * 4 + 4) = 0;
              fVar1 = (ray->super_RayK<1>).tfar;
              auVar21._4_4_ = fVar1;
              auVar21._0_4_ = fVar1;
              auVar21._8_4_ = fVar1;
              auVar21._12_4_ = fVar1;
              auVar22 = vcmpps_avx(auVar42._0_16_,auVar21,2);
              local_1bc._4_16_ = vandps_avx(auVar22,local_1bc._4_16_);
            }
            if ((((local_1bc._4_16_ >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_1bc._4_16_ >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_1bc._4_16_ >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_1bc[0x13]) {
              return;
            }
            auVar22 = vblendvps_avx(auVar39._0_16_,auVar42._0_16_,local_1bc._4_16_);
            auVar25 = vshufps_avx(auVar22,auVar22,0xb1);
            auVar25 = vminps_avx(auVar25,auVar22);
            auVar24 = vshufpd_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar24,auVar25);
            auVar25 = vcmpps_avx(auVar22,auVar25,0);
            auVar24 = local_1bc._4_16_ & auVar25;
            auVar22 = local_1bc._4_16_;
            if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar24[0xf] < '\0') {
              auVar22 = vandps_avx(auVar25,local_1bc._4_16_);
            }
            uVar15 = vmovmskps_avx(auVar22);
            uVar17 = CONCAT44((int)((ulong)pRVar16 >> 0x20),uVar15);
            lVar18 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
          } while( true );
        }
        local_168[0] = *(float *)(local_118 + lVar18 * 4);
        local_168[1] = (float)*(undefined4 *)(local_108 + lVar18 * 4);
        local_168[2] = (float)*(undefined4 *)(local_f8 + lVar18 * 4);
        local_15c = 0;
        local_154 = (sphere->primIDs).field_0.i[lVar18];
        local_14c = context->user->instID[0];
        local_148 = context->user->instPrimID[0];
        local_16c[0] = (uint)(ray->super_RayK<1>).tfar;
        (ray->super_RayK<1>).tfar = *(float *)(local_128 + lVar18 * 4);
        local_1bc._0_4_ = -NAN;
        local_1a0.valid = (int *)local_1bc;
        local_1a0.geometryUserPtr = pGVar7->userPtr;
        local_1a0.context = context->user;
        local_1a0.ray = (RTCRayN *)ray;
        local_1a0.hit = (RTCHitN *)local_168;
        local_1a0.N = 1;
        local_138 = auVar42._0_16_;
        local_e8 = auVar31;
        local_58 = auVar43;
        local_68 = auVar23;
        local_78 = auVar25;
        local_88 = auVar24;
        local_98 = auVar30;
        local_a8 = auVar27;
        local_b8 = auVar22;
        local_c8 = auVar32;
        local_d8 = auVar54._0_16_;
        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e9f332:
          p_Var9 = context->args->filter;
          if (p_Var9 != (RTCFilterFunctionN)0x0) {
            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
              (*p_Var9)(&local_1a0);
              auVar54 = ZEXT1664(local_d8);
              auVar53 = ZEXT1664(local_c8);
              auVar40 = ZEXT1664(local_b8);
              auVar52 = ZEXT1664(local_a8);
              auVar48 = ZEXT1664(local_98);
              auVar46 = ZEXT1664(local_88);
              auVar44 = ZEXT1664(local_78);
              auVar51 = ZEXT1664(local_68);
              auVar50 = ZEXT1664(local_58);
              auVar49 = ZEXT1664(local_e8);
              auVar39 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar42 = ZEXT1664(local_138);
            }
            if ((((RayK<1> *)local_1a0.valid)->org).field_0.m128[0] == 0.0) goto LAB_00e9f486;
          }
          (((Vec3f *)((long)local_1a0.ray + 0x30))->field_0).field_0.x = *(float *)local_1a0.hit;
          *(float *)((long)local_1a0.ray + 0x34) = *(float *)(local_1a0.hit + 4);
          *(float *)((long)local_1a0.ray + 0x38) = *(float *)(local_1a0.hit + 8);
          *(float *)((long)local_1a0.ray + 0x3c) = *(float *)(local_1a0.hit + 0xc);
          *(float *)((long)local_1a0.ray + 0x40) = *(float *)(local_1a0.hit + 0x10);
          *(float *)((long)local_1a0.ray + 0x44) = *(float *)(local_1a0.hit + 0x14);
          *(float *)((long)local_1a0.ray + 0x48) = *(float *)(local_1a0.hit + 0x18);
          *(float *)((long)local_1a0.ray + 0x4c) = *(float *)(local_1a0.hit + 0x1c);
          *(float *)((long)local_1a0.ray + 0x50) = *(float *)(local_1a0.hit + 0x20);
          pRVar16 = (RayHit *)local_1a0.ray;
        }
        else {
          (*pGVar7->intersectionFilterN)(&local_1a0);
          auVar54 = ZEXT1664(local_d8);
          auVar53 = ZEXT1664(local_c8);
          auVar40 = ZEXT1664(local_b8);
          auVar52 = ZEXT1664(local_a8);
          auVar48 = ZEXT1664(local_98);
          auVar46 = ZEXT1664(local_88);
          auVar44 = ZEXT1664(local_78);
          auVar51 = ZEXT1664(local_68);
          auVar50 = ZEXT1664(local_58);
          auVar49 = ZEXT1664(local_e8);
          auVar39 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar42 = ZEXT1664(local_138);
          if ((((RayK<1> *)local_1a0.valid)->org).field_0.m128[0] != 0.0) goto LAB_00e9f332;
LAB_00e9f486:
          (ray->super_RayK<1>).tfar = (float)local_16c[0];
          pRVar16 = (RayHit *)local_1a0.valid;
        }
        *(undefined4 *)(local_1bc + lVar18 * 4 + 4) = 0;
        fVar1 = (ray->super_RayK<1>).tfar;
        auVar19._4_4_ = fVar1;
        auVar19._0_4_ = fVar1;
        auVar19._8_4_ = fVar1;
        auVar19._12_4_ = fVar1;
        auVar22 = vcmpps_avx(auVar54._0_16_,auVar19,2);
        local_1bc._4_16_ = vandps_avx(auVar22,local_1bc._4_16_);
      }
      uVar15 = (undefined4)((ulong)pRVar16 >> 0x20);
      auVar30 = auVar48._0_16_;
      auVar24 = auVar46._0_16_;
      auVar25 = auVar44._0_16_;
      auVar23 = auVar51._0_16_;
      auVar43 = auVar50._0_16_;
      auVar27 = auVar52._0_16_;
      auVar31 = auVar49._0_16_;
      auVar32 = auVar53._0_16_;
      auVar22 = auVar40._0_16_;
      if ((((local_1bc._4_16_ >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_1bc._4_16_ >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_1bc._4_16_ >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_1bc[0x13]) goto LAB_00e9f510;
      auVar22 = vblendvps_avx(auVar39._0_16_,auVar54._0_16_,local_1bc._4_16_);
      auVar25 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar25 = vminps_avx(auVar25,auVar22);
      auVar24 = vshufpd_avx(auVar25,auVar25,1);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar25 = vcmpps_avx(auVar22,auVar25,0);
      auVar24 = local_1bc._4_16_ & auVar25;
      auVar22 = local_1bc._4_16_;
      if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0'
         ) {
        auVar22 = vandps_avx(auVar25,local_1bc._4_16_);
      }
      uVar14 = vmovmskps_avx(auVar22);
      lVar18 = 0;
      if (CONCAT44(uVar15,uVar14) != 0) {
        for (; (CONCAT44(uVar15,uVar14) >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      goto LAB_00e9f15a;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }